

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O3

shared_ptr<helics::helicsCLI11App> __thiscall helics::MultiBroker::generateCLI(MultiBroker *this)

{
  App *this_00;
  Option *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  string_view localAddress;
  undefined1 local_98 [32];
  string local_78;
  App_p local_58;
  function<void_()> local_48;
  
  CoreBroker::generateCLI(&this->super_CoreBroker);
  localAddress._M_str = (char *)0x9;
  localAddress._M_len = in_RSI + 0xe98;
  NetworkBrokerData::commandLineParser((NetworkBrokerData *)local_98,localAddress,true);
  local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98._0_8_;
  local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
  CLI::App::add_subcommand
            ((App *)(this->super_CoreBroker).super_Broker._vptr_Broker,(App_p *)(local_98 + 0x40));
  if (local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  helicsCLI11App::addTypeOption
            ((helicsCLI11App *)(this->super_CoreBroker).super_Broker._vptr_Broker,true);
  this_00 = (App *)(this->super_CoreBroker).super_Broker._vptr_Broker;
  *(undefined4 *)&this_00[1].description_.field_2 = *(undefined4 *)(in_RSI + 0xfac);
  local_78._M_dataplus._M_p = local_98 + 0x30;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_98 + 0x20),"-_","");
  pOVar1 = CLI::App::add_flag<const_char[1],_(CLI::detail::enabler)0>
                     (this_00,(string *)(local_98 + 0x20),(char (*) [1])0x459a74);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
  pOVar1 = CLI::OptionBase<CLI::Option>::group
                     (&pOVar1->super_OptionBase<CLI::Option>,(string *)local_98);
  pOVar1->force_callback_ = true;
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (local_78._M_dataplus._M_p != local_98 + 0x30) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_48.super__Function_base._M_functor._8_8_ =
       (this->super_CoreBroker).super_Broker._vptr_Broker;
  local_48._M_invoker =
       CLI::std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:211:25)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:211:25)>
       ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)(local_48.super__Function_base._M_functor._8_8_ + 0x90),&local_48)
  ;
  _Var2._M_pi = extraout_RDX;
  if (local_48.super__Function_base._M_manager != (code *)0x0) {
    (*local_48.super__Function_base._M_manager)(&local_48,&local_48,3);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> MultiBroker::generateCLI()
{
    auto app = CoreBroker::generateCLI();
    CLI::App_p netApp = netInfo.commandLineParser("127.0.0.1", false);
    app->add_subcommand(std::move(netApp));
    app->addTypeOption();
    app->setDefaultCoreType(type);
    // this is a null flag option for forcing the callback to run
    app->add_flag("-_", "")->group("")->force_callback();
    auto* app_p = app.get();
    app->final_callback([this, app_p]() {
        auto* copt = app_p->get_parent()->get_option("--config");
        if (copt->count() > 0) {
            configFile = app_p->get_parent()->get_option("--config")->as<std::string>();
        }
        type = app_p->getCoreType();
    });
    return app;
}